

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile_impl.cc
# Opt level: O1

int __thiscall webrtc::EchoControlMobileImpl::Enable(EchoControlMobileImpl *this,bool enable)

{
  int sample_rate_hz;
  StreamProperties *pSVar1;
  ostream *poVar2;
  int iVar3;
  CritScope cs_capture;
  CritScope cs_render;
  CritScope local_1a0;
  CritScope local_198;
  FatalMessage local_190;
  
  rtc::CritScope::CritScope(&local_198,this->crit_render_);
  rtc::CritScope::CritScope(&local_1a0,this->crit_capture_);
  if ((this->stream_properties_)._M_t.
      super___uniq_ptr_impl<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
      ._M_t.
      super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
      .super__Head_base<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_false>._M_head_impl
      == (StreamProperties *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_control_mobile_impl.cc"
               ,0x104);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"Check failed: stream_properties_",0x20);
    std::ios::widen((char)(ostream *)&local_190 + (char)*(undefined8 *)(local_190._0_8_ + -0x18));
    std::ostream::put((char)&local_190);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
    rtc::FatalMessage::~FatalMessage(&local_190);
  }
  if (enable) {
    pSVar1 = (this->stream_properties_)._M_t.
             super___uniq_ptr_impl<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
             ._M_t.
             super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
             .super__Head_base<0UL,_webrtc::EchoControlMobileImpl::StreamProperties_*,_false>.
             _M_head_impl;
    sample_rate_hz = pSVar1->sample_rate_hz;
    iVar3 = -7;
    if (16000 < sample_rate_hz) goto LAB_0017bcc8;
    if ((enable) && (this->enabled_ == false)) {
      this->enabled_ = enable;
      iVar3 = 0;
      Initialize(this,sample_rate_hz,pSVar1->num_reverse_channels,pSVar1->num_output_channels);
      goto LAB_0017bcc8;
    }
  }
  this->enabled_ = enable;
  iVar3 = 0;
LAB_0017bcc8:
  rtc::CritScope::~CritScope(&local_1a0);
  rtc::CritScope::~CritScope(&local_198);
  return iVar3;
}

Assistant:

int EchoControlMobileImpl::Enable(bool enable) {
  // Ensure AEC and AECM are not both enabled.
  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);
  RTC_DCHECK(stream_properties_);

  if (enable &&
      stream_properties_->sample_rate_hz > AudioProcessing::kSampleRate16kHz) {
    return AudioProcessing::kBadSampleRateError;
  }

  if (enable && !enabled_) {
    enabled_ = enable;  // Must be set before Initialize() is called.

    // TODO(peah): Simplify once the Enable function has been removed from
    // the public APM API.
    Initialize(stream_properties_->sample_rate_hz,
               stream_properties_->num_reverse_channels,
               stream_properties_->num_output_channels);
  } else {
    enabled_ = enable;
  }
  return AudioProcessing::kNoError;
}